

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O0

void trt_pose::parse::paf_score_graph_out_khw
               (float *score_graph,int *topology,float *paf,int *counts,float *peaks,int K,int C,
               int H,int W,int M,int num_integral_samples)

{
  int *piVar1;
  float *peaks_b;
  float *peaks_a;
  int counts_b;
  int counts_a;
  float *paf_j;
  float *paf_i;
  int cmap_b_idx;
  int cmap_a_idx;
  int paf_j_idx;
  int paf_i_idx;
  int *tk;
  float *score_graph_k;
  int k;
  int K_local;
  float *peaks_local;
  int *counts_local;
  float *paf_local;
  int *topology_local;
  float *score_graph_local;
  
  for (score_graph_k._0_4_ = 0; (int)score_graph_k < K; score_graph_k._0_4_ = (int)score_graph_k + 1
      ) {
    piVar1 = topology + ((int)score_graph_k << 2);
    paf_score_graph_out_hw
              (score_graph + (int)score_graph_k * M * M,paf + *piVar1 * H * W,
               paf + piVar1[1] * H * W,counts[piVar1[2]],counts[piVar1[3]],peaks + piVar1[2] * M * 2
               ,peaks + piVar1[3] * M * 2,H,W,M,num_integral_samples);
  }
  return;
}

Assistant:

void paf_score_graph_out_khw(float *score_graph,  // KxMxM
                             const int *topology, // Kx4
                             const float *paf,    // 2KxHxW
                             const int *counts,   // C
                             const float *peaks,  // CxMx2
                             const int K, const int C, const int H, const int W,
                             const int M, const int num_integral_samples) {
  for (int k = 0; k < K; k++) {
    float *score_graph_k = &score_graph[k * M * M];
    const int *tk = &topology[k * 4];
    const int paf_i_idx = tk[0];
    const int paf_j_idx = tk[1];
    const int cmap_a_idx = tk[2];
    const int cmap_b_idx = tk[3];
    const float *paf_i = &paf[paf_i_idx * H * W];
    const float *paf_j = &paf[paf_j_idx * H * W];

    const int counts_a = counts[cmap_a_idx];
    const int counts_b = counts[cmap_b_idx];
    const float *peaks_a = &peaks[cmap_a_idx * M * 2];
    const float *peaks_b = &peaks[cmap_b_idx * M * 2];

    paf_score_graph_out_hw(score_graph_k, paf_i, paf_j, counts_a, counts_b,
                           peaks_a, peaks_b, H, W, M, num_integral_samples);
  }
}